

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.h
# Opt level: O0

O3DGCErrorCode __thiscall
o3dgc::CompressedTriangleFans::Allocate
          (CompressedTriangleFans *this,long numVertices,long numTriangles)

{
  long numTriangles_local;
  long numVertices_local;
  CompressedTriangleFans *this_local;
  
  if (0 < numVertices) {
    Vector<long>::Allocate(&this->m_numTFANs,numVertices);
    Vector<long>::Allocate(&this->m_degrees,numVertices << 1);
    Vector<long>::Allocate(&this->m_configs,numVertices << 1);
    Vector<long>::Allocate(&this->m_operations,numVertices << 1);
    Vector<long>::Allocate(&this->m_indices,numVertices << 1);
    Vector<long>::Allocate(&this->m_trianglesOrder,numTriangles);
    Clear(this);
    return O3DGC_OK;
  }
  __assert_fail("numVertices > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                ,0x3a,"O3DGCErrorCode o3dgc::CompressedTriangleFans::Allocate(long, long)");
}

Assistant:

O3DGCErrorCode              Allocate(long numVertices, long numTriangles)
                                    {
                                        assert(numVertices > 0);
                                        m_numTFANs.Allocate(numVertices);
                                        m_degrees.Allocate(2*numVertices);
                                        m_configs.Allocate(2*numVertices);
                                        m_operations.Allocate(2*numVertices);
                                        m_indices.Allocate(2*numVertices);
                                        m_trianglesOrder.Allocate(numTriangles);
                                        Clear();
                                        return O3DGC_OK;
                                    }